

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_texshader.cpp
# Opt level: O0

void __thiscall FTextureShader::Update(FTextureShader *this,int framems)

{
  uint uVar1;
  uint uVar2;
  FShaderLayer **ppFVar3;
  uint local_1c;
  uint i;
  float diff;
  int framems_local;
  FTextureShader *this_local;
  
  uVar1 = this->lastUpdate;
  if (this->lastUpdate != 0) {
    for (local_1c = 0;
        uVar2 = TArray<FShaderLayer_*,_FShaderLayer_*>::Size
                          (&(this->layers).super_TArray<FShaderLayer_*,_FShaderLayer_*>),
        local_1c < uVar2; local_1c = local_1c + 1) {
      ppFVar3 = TArray<FShaderLayer_*,_FShaderLayer_*>::operator[]
                          (&(this->layers).super_TArray<FShaderLayer_*,_FShaderLayer_*>,
                           (ulong)local_1c);
      FShaderLayer::Update(*ppFVar3,(float)(framems - uVar1) / 1000.0);
    }
  }
  this->lastUpdate = framems;
  return;
}

Assistant:

void FTextureShader::Update(int framems)
{
	float diff = (framems - lastUpdate) / 1000.f;

	if (lastUpdate != 0) // && !paused && !bglobal.freeze)
	{
		for (unsigned int i = 0; i < layers.Size(); i++)
		{
			layers[i]->Update(diff);
		}
	}
	lastUpdate = framems;
}